

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall upb_test::FuzzTest_NanValue_Test::TestBody(FuzzTest_NanValue_Test *this)

{
  string_view local_88;
  ParseTextProtoOrDie local_78;
  FileDescriptorSet local_58;
  FuzzTest_NanValue_Test *local_10;
  FuzzTest_NanValue_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,
             "file {\n             enum_type {\n               value {\n                 number: 0\n                 options { uninterpreted_option { double_value: nan } }\n               }\n             }\n           }"
            );
  ParseTextProtoOrDie::ParseTextProtoOrDie(&local_78,local_88);
  ParseTextProtoOrDie::operator_cast_to_FileDescriptorSet(&local_58,&local_78);
  RoundTripDescriptor(&local_58);
  google::protobuf::FileDescriptorSet::~FileDescriptorSet(&local_58);
  ParseTextProtoOrDie::~ParseTextProtoOrDie(&local_78);
  return;
}

Assistant:

TEST(FuzzTest, NanValue) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             enum_type {
               value {
                 number: 0
                 options { uninterpreted_option { double_value: nan } }
               }
             }
           })pb"));
}